

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void __thiscall
pbrt::ParallelForLoop1D::RunStep(ParallelForLoop1D *this,unique_lock<std::mutex> *lock)

{
  long lVar1;
  _func_int **pp_Var2;
  ParallelJob *pPVar3;
  ParallelJob *pPVar4;
  int iVar5;
  ParallelJob **ppPVar6;
  long lVar7;
  long local_30;
  long local_28;
  
  lVar1 = this->nextIndex;
  pp_Var2 = (this->super_ParallelJob)._vptr_ParallelJob;
  lVar7 = this->chunkSize + lVar1;
  if (this->endIndex < lVar7) {
    lVar7 = this->endIndex;
  }
  this->nextIndex = lVar7;
  iVar5 = (*pp_Var2[2])();
  if ((char)iVar5 == '\0') {
    pPVar3 = (this->super_ParallelJob).prev;
    pPVar4 = (this->super_ParallelJob).next;
    ppPVar6 = &pPVar3->next;
    if (pPVar3 == (ParallelJob *)0x0) {
      ppPVar6 = (ParallelJob **)(threadPool + 0x48);
    }
    *ppPVar6 = pPVar4;
    if (pPVar4 != (ParallelJob *)0x0) {
      pPVar4->prev = pPVar3;
    }
    (this->super_ParallelJob).removed = true;
  }
  std::unique_lock<std::mutex>::unlock(lock);
  local_30 = lVar7;
  local_28 = lVar1;
  if ((this->func).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->func)._M_invoker)((_Any_data *)&this->func,&local_28,&local_30);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void ParallelForLoop1D::RunStep(std::unique_lock<std::mutex> *lock) {
    // Determine the range of loop iterations to run in this step
    int64_t indexStart = nextIndex;
    int64_t indexEnd = std::min(indexStart + chunkSize, endIndex);
    nextIndex = indexEnd;

    // Remove job from list if all work has been started
    if (!HaveWork())
        threadPool->RemoveFromJobList(this);

    // Release lock and execute loop iterations in _[indexStart, indexEnd)_
    lock->unlock();
    func(indexStart, indexEnd);
}